

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_tweak_mul(secp256k1_ge *key,secp256k1_scalar *tweak)

{
  int iVar1;
  secp256k1_gej pt;
  secp256k1_scalar *in_stack_00000798;
  secp256k1_scalar *in_stack_000007a0;
  secp256k1_gej *in_stack_000007a8;
  secp256k1_gej *in_stack_000007b0;
  secp256k1_ge *in_stack_ffffffffffffff68;
  secp256k1_gej *in_stack_ffffffffffffff70;
  secp256k1_gej *in_stack_ffffffffffffffb8;
  secp256k1_ge *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x104814);
  if (iVar1 == 0) {
    secp256k1_gej_set_ge(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    secp256k1_ecmult(in_stack_000007b0,in_stack_000007a8,in_stack_000007a0,in_stack_00000798);
    secp256k1_ge_set_gej(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_mul(secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_gej pt;
    if (secp256k1_scalar_is_zero(tweak)) {
        return 0;
    }

    secp256k1_gej_set_ge(&pt, key);
    secp256k1_ecmult(&pt, &pt, tweak, &secp256k1_scalar_zero);
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}